

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall ThreadedReplayer::free_pipelines(ThreadedReplayer *this)

{
  PFN_vkDestroyPipeline p_Var1;
  bool bVar2;
  reference ppVar3;
  pointer pVVar4;
  VkDevice pVVar5;
  size_type sVar6;
  pair<const_unsigned_long,_VkPipeline_T_*> *pipeline_2;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *__range1_2;
  pair<const_unsigned_long,_VkPipeline_T_*> *pipeline_1;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *__range1_1;
  pair<const_unsigned_long,_VkPipeline_T_*> *pipeline;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  *__range1;
  ThreadedReplayer *this_local;
  
  __end1 = std::
           unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
           ::begin(&this->compute_pipelines);
  pipeline = (pair<const_unsigned_long,_VkPipeline_T_*> *)
             std::
             unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
             ::end(&this->compute_pipelines);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                         *)&pipeline);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::operator*
                       (&__end1);
    p_Var1 = vkDestroyPipeline;
    if (ppVar3->second != (VkPipeline_T *)0x0) {
      pVVar4 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      pVVar5 = Fossilize::VulkanDevice::get_device(pVVar4);
      (*p_Var1)(pVVar5,ppVar3->second,(VkAllocationCallbacks *)0x0);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::
    operator++(&__end1);
  }
  __end1_1 = std::
             unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
             ::begin(&this->graphics_pipelines);
  pipeline_1 = (pair<const_unsigned_long,_VkPipeline_T_*> *)
               std::
               unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
               ::end(&this->graphics_pipelines);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                         *)&pipeline_1);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::operator*
                       (&__end1_1);
    p_Var1 = vkDestroyPipeline;
    if (ppVar3->second != (VkPipeline_T *)0x0) {
      pVVar4 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      pVVar5 = Fossilize::VulkanDevice::get_device(pVVar4);
      (*p_Var1)(pVVar5,ppVar3->second,(VkAllocationCallbacks *)0x0);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::
    operator++(&__end1_1);
  }
  __end1_2 = std::
             unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
             ::begin(&this->raytracing_pipelines);
  pipeline_2 = (pair<const_unsigned_long,_VkPipeline_T_*> *)
               std::
               unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
               ::end(&this->raytracing_pipelines);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1_2.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>
                         *)&pipeline_2);
    if (!bVar2) break;
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::operator*
                       (&__end1_2);
    p_Var1 = vkDestroyPipeline;
    if (ppVar3->second != (VkPipeline_T *)0x0) {
      pVVar4 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      pVVar5 = Fossilize::VulkanDevice::get_device(pVVar4);
      (*p_Var1)(pVVar5,ppVar3->second,(VkAllocationCallbacks *)0x0);
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false,_false>::
    operator++(&__end1_2);
  }
  sVar6 = std::
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          ::size(&this->compute_pipelines);
  this->compute_pipelines_cleared = sVar6 + this->compute_pipelines_cleared;
  sVar6 = std::
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          ::size(&this->graphics_pipelines);
  this->graphics_pipelines_cleared = sVar6 + this->graphics_pipelines_cleared;
  sVar6 = std::
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          ::size(&this->raytracing_pipelines);
  this->raytracing_pipelines_cleared = sVar6 + this->raytracing_pipelines_cleared;
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::clear(&this->compute_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::clear(&this->graphics_pipelines);
  std::
  unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
  ::clear(&this->raytracing_pipelines);
  return;
}

Assistant:

void free_pipelines()
	{
		for (auto &pipeline : compute_pipelines)
			if (pipeline.second)
				vkDestroyPipeline(device->get_device(), pipeline.second, nullptr);
		for (auto &pipeline : graphics_pipelines)
			if (pipeline.second)
				vkDestroyPipeline(device->get_device(), pipeline.second, nullptr);
		for (auto &pipeline : raytracing_pipelines)
			if (pipeline.second)
				vkDestroyPipeline(device->get_device(), pipeline.second, nullptr);

		// Keep track of how many entries we would have had for accurate reporting.
		compute_pipelines_cleared += compute_pipelines.size();
		graphics_pipelines_cleared += graphics_pipelines.size();
		raytracing_pipelines_cleared += raytracing_pipelines.size();

		compute_pipelines.clear();
		graphics_pipelines.clear();
		raytracing_pipelines.clear();
	}